

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O1

void __thiscall Personality::PersonalityConsequences(Personality *this)

{
  Item *this_00;
  int iVar1;
  _List_node_base *p_Var2;
  
  for (p_Var2 = (this->followers).super__List_base<Follower_*,_std::allocator<Follower_*>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var2 != (_List_node_base *)&this->followers
      ; p_Var2 = p_Var2->_M_next) {
    Follower::setTapped((Follower *)p_Var2[1]._M_next,true);
  }
  for (p_Var2 = (this->items).super__List_base<Item_*,_std::allocator<Item_*>_>._M_impl._M_node.
                super__List_node_base._M_next; p_Var2 != (_List_node_base *)&this->items;
      p_Var2 = p_Var2->_M_next) {
    this_00 = (Item *)p_Var2[1]._M_next;
    iVar1 = Item::getDurability(this_00);
    Item::setDurability(this_00,iVar1 + -1);
  }
  return;
}

Assistant:

void Personality::PersonalityConsequences()
{
    list<Follower*>::iterator itf;
    if (!followers.empty())
    {
        for (itf=followers.begin(); itf!=followers.end(); itf++)
            (*itf)->setTapped(true);
    }

    list<Item*>::iterator iti;
    if (!items.empty())
    {
        for (iti=items.begin(); iti!=items.end(); iti++)
            (*iti)->setDurability((*iti)->getDurability()-1);
    }
}